

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PixelToasterUnix.h
# Opt level: O1

void __thiscall PixelToaster::UnixDisplay::title(UnixDisplay *this,char *title)

{
  ulong uVar1;
  
  uVar1 = 0;
  do {
    if (title[uVar1] == '\0') goto LAB_00108646;
    (this->super_DisplayAdapter)._title[uVar1] = title[uVar1];
    uVar1 = uVar1 + 1;
  } while (uVar1 != 0xff);
  uVar1 = 0xff;
LAB_00108646:
  (this->super_DisplayAdapter)._title[uVar1 & 0xffffffff] = '\0';
  if ((this->display_ != (Display *)0x0) && (this->window_ != 0)) {
    XStoreName(this->display_);
    return;
  }
  return;
}

Assistant:

void title(const char title[]) override
    {
        DisplayAdapter::title(title);

        if (display_ && window_)
            ::XStoreName(display_, window_, title);
    }